

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

int Cba_StrCmp(char **pp1,char **pp2)

{
  char *p1;
  char *p2;
  long lVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  char cVar5;
  bool bVar6;
  
  p1 = *pp1;
  p2 = *pp2;
  cVar2 = *p1;
  bVar6 = cVar2 == '\0';
  if (bVar6) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    cVar5 = *p2;
    while (cVar5 != '\0') {
      if (cVar2 != cVar5) goto LAB_003aa70d;
      cVar2 = p1[uVar4 + 1];
      bVar6 = cVar2 == '\0';
      if (bVar6) {
        uVar4 = (ulong)((int)uVar4 + 1);
        goto LAB_003aa70d;
      }
      lVar1 = uVar4 + 1;
      uVar4 = uVar4 + 1;
      cVar5 = p2[lVar1];
    }
    if ((!bVar6) && (p2[uVar4] != '\0')) {
      __assert_fail("!p1[i] || !p2[i]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaNtk.c"
                    ,0x1a9,"int Cba_StrCmp(char **, char **)");
    }
  }
LAB_003aa70d:
  iVar3 = Cba_StrCmpInt(p1,p2,(int)uVar4);
  return iVar3;
}

Assistant:

int Cba_StrCmp( char ** pp1, char ** pp2 )
{
    char * p1 = *pp1;
    char * p2 = *pp2; int i;
    for ( i = 0; p1[i] && p2[i]; i++ )
        if ( p1[i] != p2[i] )
            return Cba_StrCmpInt( p1, p2, i );
    assert( !p1[i] || !p2[i] );
    return Cba_StrCmpInt( p1, p2, i );
}